

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

base_learner * marginal_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<float> *this;
  pointer pdVar2;
  long lVar3;
  base_learner *f;
  learner<MARGINAL::data,_example> *this_00;
  vw *in_RSI;
  long *in_RDI;
  learner<MARGINAL::data,_example> *ret;
  size_t u;
  option_group_definition marginal_options;
  string marginal;
  free_ptr<MARGINAL::data> d;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff308;
  vw *in_stack_fffffffffffff310;
  string *in_stack_fffffffffffff318;
  typed_option<float> *in_stack_fffffffffffff320;
  vw *this_01;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff358;
  typed_option<float> *op;
  option_group_definition *in_stack_fffffffffffff360;
  ulong local_bd8;
  allocator local_bc9;
  string local_bc8 [39];
  allocator<char> local_ba1;
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [72];
  learner<char,_char> *in_stack_fffffffffffff4d0;
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [359];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [359];
  allocator local_6f1;
  string local_6f0 [39];
  allocator local_6c9;
  string local_6c8 [359];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [359];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [359];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8 [2];
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [56];
  string local_48 [48];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<MARGINAL::data>();
  std::__cxx11::string::string(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"VW options",&local_a1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff310,
             (string *)in_stack_fffffffffffff308);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"marginal",&local_219);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff318,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff310);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"substitute marginal label estimates for ids",&local_241);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"initial_denominator",&local_3a9);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3732c1);
  VW::config::make_option<float>(in_stack_fffffffffffff318,(float *)in_stack_fffffffffffff310);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff320,(float)((ulong)in_stack_fffffffffffff318 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"initial denominator",&local_3d1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff310,
             (typed_option<float> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff360,(typed_option<float> *)in_stack_fffffffffffff358);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"initial_numerator",&local_539);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x37340c);
  VW::config::make_option<float>(in_stack_fffffffffffff318,(float *)in_stack_fffffffffffff310);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff320,(float)((ulong)in_stack_fffffffffffff318 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"initial numerator",&local_561);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff310,
             (typed_option<float> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff360,(typed_option<float> *)in_stack_fffffffffffff358);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"compete",&local_6c9);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x373553);
  VW::config::make_option<bool>(in_stack_fffffffffffff318,(bool *)in_stack_fffffffffffff310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"enable competition with marginal features",&local_6f1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff310,
             (typed_option<bool> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff360,(typed_option<bool> *)in_stack_fffffffffffff358);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"update_before_learn",&local_859);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x373682);
  VW::config::make_option<bool>(in_stack_fffffffffffff318,(bool *)in_stack_fffffffffffff310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"update marginal values before learning",&local_881);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff310,
             (typed_option<bool> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff360,(typed_option<bool> *)in_stack_fffffffffffff358);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"unweighted_marginals",&local_9e9);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3737a8);
  VW::config::make_option<bool>(in_stack_fffffffffffff318,(bool *)in_stack_fffffffffffff310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a10,"ignore importance weights when computing marginals",&local_a11);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff310,
             (typed_option<bool> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff360,(typed_option<bool> *)in_stack_fffffffffffff358);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b78,"decay",&local_b79);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3738c2);
  VW::config::make_option<float>(in_stack_fffffffffffff318,(float *)in_stack_fffffffffffff310);
  this = VW::config::typed_option<float>::default_value
                   (in_stack_fffffffffffff320,(float)((ulong)in_stack_fffffffffffff318 >> 0x20));
  op = (typed_option<float> *)&local_ba1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ba0,"decay multiplier per event (1e-3 for example)",(allocator *)op);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff310,
             (typed_option<float> *)in_stack_fffffffffffff308);
  VW::config::option_group_definition::add<float>((option_group_definition *)this,op);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  (**(code **)*local_10)(local_10,local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"marginal",&local_bc9);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_bc8);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    pdVar2 = std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3740ea);
    pdVar2->all = local_18;
    this_01 = local_18;
    for (local_bd8 = 0; local_bd8 < 0x100; local_bd8 = local_bd8 + 1) {
      lVar3 = std::__cxx11::string::find((char)local_48,(ulong)(uint)(int)(char)local_bd8);
      if (lVar3 != -1) {
        pdVar2 = std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
                           ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x37413f);
        pdVar2->id_features[local_bd8] = true;
      }
    }
    f = setup_base((options_i *)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
    in_stack_fffffffffffff320 =
         (typed_option<float> *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffff4d0);
    this_00 = LEARNER::init_learner<MARGINAL::data,example,LEARNER::learner<char,example>>
                        ((free_ptr<MARGINAL::data> *)in_stack_fffffffffffff320,
                         (learner<char,_example> *)in_stack_fffffffffffff318,
                         (_func_void_data_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff310,
                         (_func_void_data_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff308);
    LEARNER::learner<MARGINAL::data,_example>::set_finish
              ((learner<MARGINAL::data,_example> *)this_01,(_func_void_data_ptr *)f);
    LEARNER::learner<MARGINAL::data,_example>::set_save_load(this_00,MARGINAL::save_load);
    in_stack_fffffffffffff310 = (vw *)LEARNER::make_base<MARGINAL::data,example>(this_00);
    local_8 = in_stack_fffffffffffff310;
  }
  else {
    local_8 = (vw *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff310);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)in_stack_fffffffffffff320);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}